

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Errors.hpp
# Opt level: O0

void Diligent::
     LogError<false,char[10],char_const*,char[4],char[12],unsigned_int,char[31],unsigned_int,char[2]>
               (bool IsFatal,char *Function,char *FullFilePath,int Line,char (*Args) [10],
               char **Args_1,char (*Args_2) [4],char (*Args_3) [12],uint *Args_4,char (*Args_5) [31]
               ,uint *Args_6,char (*Args_7) [2])

{
  undefined *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ostream *poVar4;
  char *pcVar5;
  char (*in_stack_fffffffffffffee0) [2];
  undefined1 local_98 [8];
  string Msg;
  size_type LastSlashPos;
  allocator local_59;
  string local_58 [8];
  string FileName;
  char **Args_local_1;
  char (*Args_local) [10];
  int Line_local;
  char *FullFilePath_local;
  char *Function_local;
  bool IsFatal_local;
  
  FileName.field_2._8_8_ = Args_1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,FullFilePath,&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  Msg.field_2._8_8_ = std::__cxx11::string::find_last_of((char *)local_58,0xc073fa);
  if (Msg.field_2._8_8_ != -1) {
    std::__cxx11::string::erase((ulong)local_58,0);
  }
  FormatString<char[10],char_const*,char[4],char[12],unsigned_int,char[31],unsigned_int,char[2]>
            ((string *)local_98,(Diligent *)Args,(char (*) [10])FileName.field_2._8_8_,
             (char **)Args_2,(char (*) [4])Args_3,(char (*) [12])Args_4,(uint *)Args_5,
             (char (*) [31])Args_6,(uint *)Args_7,in_stack_fffffffffffffee0);
  puVar1 = DebugMessageCallback;
  if (DebugMessageCallback == (undefined *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Diligent Engine: ");
    pcVar5 = "Error";
    if (IsFatal) {
      pcVar5 = "Fatal Error";
    }
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4," in ");
    poVar4 = std::operator<<(poVar4,Function);
    poVar4 = std::operator<<(poVar4,"() (");
    poVar4 = std::operator<<(poVar4,local_58);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,Line);
    poVar4 = std::operator<<(poVar4,"): ");
    poVar4 = std::operator<<(poVar4,(string *)local_98);
    std::operator<<(poVar4,'\n');
  }
  else {
    uVar2 = std::__cxx11::string::c_str();
    uVar3 = std::__cxx11::string::c_str();
    (*(code *)puVar1)(IsFatal | 2,uVar2,Function,uVar3,Line);
  }
  ThrowIf<false>((string *)local_98);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void LogError(bool IsFatal, const char* Function, const char* FullFilePath, int Line, const ArgsType&... Args)
{
    std::string FileName(FullFilePath);

    auto LastSlashPos = FileName.find_last_of("/\\");
    if (LastSlashPos != std::string::npos)
        FileName.erase(0, LastSlashPos + 1);
    auto Msg = FormatString(Args...);
    if (DebugMessageCallback != nullptr)
    {
        DebugMessageCallback(IsFatal ? DEBUG_MESSAGE_SEVERITY_FATAL_ERROR : DEBUG_MESSAGE_SEVERITY_ERROR, Msg.c_str(), Function, FileName.c_str(), Line);
    }
    else
    {
        // No callback set - output to cerr
        std::cerr << "Diligent Engine: " << (IsFatal ? "Fatal Error" : "Error") << " in " << Function << "() (" << FileName << ", " << Line << "): " << Msg << '\n';
    }
    ThrowIf<bThrowException>(std::move(Msg));
}